

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::StartBoundary
          (CrossingProcessor *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result)

{
  this->a_region_id_ = a_region_id;
  this->b_region_id_ = 1 - a_region_id;
  this->invert_a_ = invert_a;
  this->invert_b_ = invert_b;
  this->invert_result_ = invert_result;
  this->is_union_ = invert_b && invert_result;
  SetClippingState(this,-3,invert_a != invert_result);
  SetClippingState(this,-2,invert_b);
  return;
}

Assistant:

void S2BooleanOperation::Impl::CrossingProcessor::StartBoundary(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result) {
  a_region_id_ = a_region_id;
  b_region_id_ = 1 - a_region_id;
  invert_a_ = invert_a;
  invert_b_ = invert_b;
  invert_result_ = invert_result;
  is_union_ = invert_b && invert_result;

  // Specify to GraphEdgeClipper how these edges should be clipped.
  SetClippingState(kSetReverseA, invert_a != invert_result);
  SetClippingState(kSetInvertB, invert_b);
}